

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O2

int iniparser_getsecnkeys(dictionary *d,char *s)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  char keym [1025];
  char acStack_438 [1032];
  
  iVar3 = 0;
  if (d != (dictionary *)0x0) {
    iVar1 = iniparser_find_entry(d,s);
    iVar3 = 0;
    if (iVar1 != 0) {
      sVar2 = strlen(s);
      lVar5 = 0;
      sprintf(acStack_438,"%s:",s);
      lVar4 = d->size;
      if (d->size < 1) {
        lVar4 = lVar5;
      }
      iVar3 = 0;
      for (; lVar4 != lVar5; lVar5 = lVar5 + 1) {
        if (d->key[lVar5] != (char *)0x0) {
          iVar1 = strncmp(d->key[lVar5],acStack_438,(long)((int)sVar2 + 1));
          iVar3 = iVar3 + (uint)(iVar1 == 0);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int iniparser_getsecnkeys(const dictionary * d, const char * s)
{
    int     seclen, nkeys ;
    char    keym[ASCIILINESZ+1];
    int j ;

    nkeys = 0;

    if (d==NULL) return nkeys;
    if (! iniparser_find_entry(d, s)) return nkeys;

    seclen  = (int)strlen(s);
    sprintf(keym, "%s:", s);

    for (j=0 ; j<d->size ; j++) {
        if (d->key[j]==NULL)
            continue ;
        if (!strncmp(d->key[j], keym, seclen+1))
            nkeys++;
    }

    return nkeys;

}